

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int64_suite::fail_array8_int64_overflow(void)

{
  pointer buffer;
  size_type size;
  undefined4 local_6c;
  size_type local_68 [2];
  array<long,_1UL> local_58;
  array<long,_1UL> value;
  decoder decoder;
  value_type input [18];
  
  decoder.current.view._M_str = (uchar *)0x66554433221110ae;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[18]>
            ((decoder *)&value,(uchar (*) [18])&decoder.current.view._M_str);
  memset(&local_58,0,8);
  buffer = std::array<long,_1UL>::data(&local_58);
  size = std::array<long,_1UL>::size(&local_58);
  local_68[0] = trial::protocol::bintoken::detail::decoder::array((decoder *)&value,buffer,size);
  local_6c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("decoder.array(value.data(), value.size())","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xae0,"void compact_int64_suite::fail_array8_int64_overflow()",local_68,&local_6c);
  return;
}

Assistant:

void fail_array8_int64_overflow()
{
    const value_type input[] = { token::code::array8_int64, 0x10, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xAA, 0xBB, 0xCC, 0xDD, 0xEE, 0xFF, 0x00 };
    format::detail::decoder decoder(input);
    std::array<std::int64_t, 1> value = {};
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.array(value.data(), value.size()), 1);
}